

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::setWindowFlags(QWidgetPrivate *this,WindowFlags flags)

{
  QFlagsStorageHelper<Qt::WindowType,_4> QVar1;
  uint uVar2;
  uint uVar3;
  QWidget *this_00;
  long in_FS_OFFSET;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  QVar1.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i;
  if (QVar1.super_QFlagsStorage<Qt::WindowType>.i !=
      (QFlagsStorage<Qt::WindowType>)
      flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i) {
    if ((((uint)QVar1.super_QFlagsStorage<Qt::WindowType>.i |
         (uint)flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i) & 1) == 0) {
      (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i =
           (Int)flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i;
    }
    else {
      local_38 = QWidget::pos(this_00);
      uVar2 = this_00->data->widget_attributes;
      uVar3 = (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i;
      QWidget::setParent(this_00,*(QWidget **)(*(long *)&this_00->field_0x8 + 0x10),flags);
      if ((((uVar3 ^ (uint)flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                           super_QFlagsStorage<Qt::WindowType>.i) & 1) == 0) &&
         (((short)uVar2 < 0 || ((*(byte *)(*(long *)&this_00->field_0x8 + 0x241) & 8) != 0)))) {
        QWidget::move(this_00,&local_38);
      }
      adjustQuitOnCloseAttribute(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWindowFlags(Qt::WindowFlags flags)
{
    Q_Q(QWidget);
    if (q->data->window_flags == flags)
        return;

    if ((q->data->window_flags | flags) & Qt::Window) {
        // the old type was a window and/or the new type is a window
        QPoint oldPos = q->pos();
        bool visible = q->isVisible();
        const bool windowFlagChanged = (q->data->window_flags ^ flags) & Qt::Window;
        q->setParent(q->parentWidget(), flags);

        // if both types are windows or neither of them are, we restore
        // the old position
        if (!windowFlagChanged && (visible || q->testAttribute(Qt::WA_Moved)))
            q->move(oldPos);
        // for backward-compatibility we change Qt::WA_QuitOnClose attribute value only when the window was recreated.
        adjustQuitOnCloseAttribute();
    } else {
        q->data->window_flags = flags;
    }
}